

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall program_options::command_line_parser::run_impl(command_line_parser *this)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  element_type *peVar9;
  reference pvVar10;
  undefined8 uVar11;
  char *pcVar12;
  command_line_parser *in_RSI;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *in_RDI;
  uint i_4;
  option *opt_2;
  uint i_3;
  uint position;
  uint i_2;
  int position_key;
  option *opt2;
  uint j_1;
  int can_take_more;
  uint max_tokens;
  uint min_tokens;
  error_with_option_name *e_1;
  option_description *xd;
  option *opt_1;
  uint i_1;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  result2;
  option opt;
  uint j;
  uint k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  next;
  uint current_size;
  uint i;
  bool ok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  style_parsers;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *result;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  basic_option<char> *in_stack_fffffffffffffc60;
  value_type *in_stack_fffffffffffffc68;
  string *in_stack_fffffffffffffc70;
  const_iterator in_stack_fffffffffffffc78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  option_description *in_stack_fffffffffffffce8;
  undefined6 in_stack_fffffffffffffcf0;
  uint local_26c;
  uint local_260;
  uint local_25c;
  uint local_258;
  int local_254;
  uint local_248;
  int local_244;
  uint local_1f4;
  uint local_158;
  uint local_154;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  local_138;
  uint local_11c;
  uint local_118;
  byte local_111;
  command_line_parser *local_110;
  byte local_101;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  option *in_stack_ffffffffffffff98;
  command_line_parser *in_stack_ffffffffffffffa0;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  local_28;
  
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ::vector((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
            *)0x130527);
  if ((in_RSI->m_style & allow_long) != 0) {
    std::
    function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>
    ::function<program_options::command_line_parser::run_impl()::__0,void>
              ((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)in_stack_fffffffffffffc70,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc68);
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
    ::push_back((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                 *)in_stack_fffffffffffffc60,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
    std::
    function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)0x13058b);
  }
  if ((in_RSI->m_style & allow_long_disguise) != 0) {
    std::
    function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>
    ::function<program_options::command_line_parser::run_impl()::__1,void>
              ((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)in_stack_fffffffffffffc70,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc68);
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
    ::push_back((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                 *)in_stack_fffffffffffffc60,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
    std::
    function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)0x130619);
  }
  if (((in_RSI->m_style & allow_short) != 0) && ((in_RSI->m_style & allow_dash_for_short) != 0)) {
    std::
    function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>
    ::function<program_options::command_line_parser::run_impl()::__2,void>
              ((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)in_stack_fffffffffffffc70,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc68);
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
    ::push_back((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                 *)in_stack_fffffffffffffc60,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
    std::
    function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)0x1306bc);
  }
  if (((in_RSI->m_style & allow_short) != 0) && ((in_RSI->m_style & allow_slash_for_short) != 0)) {
    std::
    function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>
    ::function<program_options::command_line_parser::run_impl()::__3,void>
              ((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)in_stack_fffffffffffffc70,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc68);
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
    ::push_back((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                 *)in_stack_fffffffffffffc60,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffc5f,
                         CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
    std::
    function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::~function((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 *)0x13075f);
  }
  std::
  function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>
  ::function<program_options::command_line_parser::run_impl()::__4,void>
            ((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)in_stack_fffffffffffffc70,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffc68);
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ::push_back((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
               *)in_stack_fffffffffffffc60,
              (value_type *)
              CONCAT17(in_stack_fffffffffffffc5f,
                       CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
  std::
  function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x1307d8);
  local_101 = 0;
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            *)0x1307ed);
  local_110 = in_RSI;
  while (bVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffc70), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_111 = 0;
    for (local_118 = 0; uVar8 = (ulong)local_118,
        sVar6 = std::
                vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                ::size(&local_28), uVar8 < sVar6; local_118 = local_118 + 1) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_110->m_rawArguments);
      local_11c = (uint)sVar6;
      std::
      vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
      ::operator[](&local_28,(ulong)local_118);
      std::
      function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                    *)in_stack_fffffffffffffc78._M_current,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc70);
      bVar1 = std::
              vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ::empty((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       *)in_stack_fffffffffffffc70);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1308be);
        for (local_154 = 0;
            sVar6 = std::
                    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                    ::size(&local_138), (ulong)local_154 < sVar6 - 1; local_154 = local_154 + 1) {
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::operator[](&local_138,(ulong)local_154);
          finish_option(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                *)in_stack_fffffffffffffc60);
        finish_option(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
        for (local_158 = 0;
            sVar6 = std::
                    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                    ::size(&local_138), local_158 < sVar6; local_158 = local_158 + 1) {
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::operator[](&local_138,(ulong)local_158);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc70);
      }
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_110->m_rawArguments);
      uVar8 = (ulong)local_11c;
      if (sVar6 != uVar8) {
        local_111 = 1;
      }
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 *)in_stack_fffffffffffffc70);
      if (sVar6 != uVar8) break;
    }
    if ((local_111 & 1) == 0) {
      basic_option<char>::basic_option(in_stack_fffffffffffffc60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_110->m_rawArguments,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->string_key);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_110->m_rawArguments,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->string_key);
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffc5f,
                          CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc60,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffc5f,
                             CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc78);
      basic_option<char>::~basic_option(in_stack_fffffffffffffc60);
    }
  }
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            *)0x130c1e);
  for (local_1f4 = 0;
      sVar6 = std::
              vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ::size(in_RDI), local_1f4 < sVar6; local_1f4 = local_1f4 + 1) {
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::operator[](in_RDI,(ulong)local_1f4);
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    pvVar7 = std::
             vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
             ::back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)in_stack_fffffffffffffc60);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      is_style_active(in_RSI,allow_guessing);
      uVar2 = is_style_active(in_RSI,long_case_insensitive);
      bVar1 = is_style_active(in_RSI,short_case_insensitive);
      in_stack_fffffffffffffce8 =
           options_description::find_nothrow
                     ((options_description *)
                      CONCAT17(uVar2,CONCAT16(bVar1,in_stack_fffffffffffffcf0)),
                      &in_stack_fffffffffffffce8->m_short_name,(bool)in_stack_fffffffffffffce7,
                      (bool)in_stack_fffffffffffffce6,(bool)in_stack_fffffffffffffce5);
      if (in_stack_fffffffffffffce8 != (option_description *)0x0) {
        option_description::semantic
                  ((option_description *)
                   CONCAT17(in_stack_fffffffffffffc5f,
                            CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
        peVar9 = std::
                 __shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x130e9d);
        uVar4 = (*peVar9->_vptr_value_base[3])();
        std::shared_ptr<const_program_options::value_base>::~shared_ptr
                  ((shared_ptr<const_program_options::value_base> *)0x130ebc);
        option_description::semantic
                  ((option_description *)
                   CONCAT17(in_stack_fffffffffffffc5f,
                            CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
        peVar9 = std::
                 __shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x130eeb);
        uVar5 = (*peVar9->_vptr_value_base[4])();
        std::shared_ptr<const_program_options::value_base>::~shared_ptr
                  ((shared_ptr<const_program_options::value_base> *)0x130f0a);
        if ((uVar4 < uVar5) &&
           (sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&pvVar7->value), sVar6 < uVar5)) {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&pvVar7->value);
          local_244 = uVar5 - (int)sVar6;
          while( true ) {
            local_248 = local_1f4 + 1;
            bVar1 = false;
            if (local_244 != 0) {
              sVar6 = std::
                      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      ::size(in_RDI);
              bVar1 = local_248 < sVar6;
            }
            if (!bVar1) break;
            pvVar10 = std::
                      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      ::operator[](in_RDI,(ulong)local_248);
            uVar8 = std::__cxx11::string::empty();
            if (((uVar8 & 1) == 0) || (pvVar10->position_key == 0x7fffffff)) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&pvVar10->value,0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->string_key);
            in_stack_fffffffffffffca0 = &pvVar7->original_tokens;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&pvVar10->original_tokens,0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->string_key);
            local_244 = local_244 + -1;
            local_1f4 = local_248;
          }
        }
      }
    }
  }
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::swap((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          *)in_stack_fffffffffffffc70,
         (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          *)in_stack_fffffffffffffc68);
  local_254 = 0;
  for (local_258 = 0;
      sVar6 = std::
              vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              ::size(in_RDI), local_258 < sVar6; local_258 = local_258 + 1) {
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::operator[](in_RDI,(ulong)local_258);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      pvVar7 = std::
               vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ::operator[](in_RDI,(ulong)local_258);
      pvVar7->position_key = local_254;
      local_254 = local_254 + 1;
    }
  }
  if (in_RSI->m_positional_options_description != (positional_options_description *)0x0) {
    local_25c = 0;
    for (local_260 = 0;
        sVar6 = std::
                vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                ::size(in_RDI), local_260 < sVar6; local_260 = local_260 + 1) {
      pvVar7 = std::
               vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ::operator[](in_RDI,(ulong)local_260);
      if (pvVar7->position_key != -1) {
        uVar4 = positional_options_description::max_total_count
                          ((positional_options_description *)
                           CONCAT17(in_stack_fffffffffffffc5f,
                                    CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)));
        if (uVar4 <= local_25c) {
          uVar11 = __cxa_allocate_exception(0x10);
          too_many_positional_options_error::too_many_positional_options_error
                    ((too_many_positional_options_error *)in_stack_fffffffffffffca0);
          __cxa_throw(uVar11,&too_many_positional_options_error::typeinfo,
                      too_many_positional_options_error::~too_many_positional_options_error);
        }
        in_stack_fffffffffffffc70 =
             positional_options_description::name_for_position_abi_cxx11_
                       ((positional_options_description *)in_stack_fffffffffffffc68,
                        (uint)((ulong)in_stack_fffffffffffffc60 >> 0x20));
        std::__cxx11::string::operator=((string *)pvVar7,(string *)in_stack_fffffffffffffc70);
        local_25c = local_25c + 1;
      }
    }
  }
  local_26c = 0;
  do {
    uVar8 = (ulong)local_26c;
    sVar6 = std::
            vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            ::size(in_RDI);
    if (sVar6 <= uVar8) {
      local_101 = 1;
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 *)in_stack_fffffffffffffc70);
      if ((local_101 & 1) == 0) {
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   *)in_stack_fffffffffffffc70);
      }
      std::
      vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
      ::~vector((vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                 *)in_stack_fffffffffffffc70);
      return in_RDI;
    }
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::operator[](in_RDI,(ulong)local_26c);
    uVar8 = std::__cxx11::string::size();
    if (uVar8 < 3) {
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::operator[](in_RDI,(ulong)local_26c);
      uVar8 = std::__cxx11::string::size();
      if (1 < uVar8) {
        pvVar7 = std::
                 vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 ::operator[](in_RDI,(ulong)local_26c);
        pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
        if (*pcVar12 != '-') goto LAB_001313fe;
      }
      bVar3 = is_style_active(in_RSI,short_case_insensitive);
      pvVar7 = std::
               vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ::operator[](in_RDI,(ulong)local_26c);
      pvVar7->case_insensitive = (bool)(bVar3 & 1);
    }
    else {
LAB_001313fe:
      bVar3 = is_style_active(in_RSI,long_case_insensitive);
      pvVar7 = std::
               vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
               ::operator[](in_RDI,(ulong)local_26c);
      pvVar7->case_insensitive = (bool)(bVar3 & 1);
    }
    local_26c = local_26c + 1;
  } while( true );
}

Assistant:

std::vector<option> command_line_parser::run_impl()
{
    using namespace command_line_style;
    // The parsing is done by having a set of 'style parsers'
    // and trying then in order. Each parser is passed a vector
    // of unparsed tokens and can consume some of them (by
    // removing elements on front) and return a vector of options.
    //
    // We try each style parser in turn, untill some input
    // is consumed. The returned vector of option may contain the
    // result of just syntactic parsing of token, say --foo will
    // be parsed as option with name 'foo', and the style parser
    // is not required to care if that option is defined, and how
    // many tokens the value may take.
    // So, after vector is returned, we validate them.
    assert(m_options_description);

    std::vector<style_parser> style_parsers;

    //if (m_style_parser)
    //    style_parsers.push_back(m_style_parser);

    //if (m_additional_parser) {
    //    style_parsers.push_back([this] (std::vector<std::string>& args) {
    //        return this->handle_additional_parser(args);
    //    });
    //}

    if (m_style & allow_long) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_long_option(args);
        });
    }

    if ((m_style & allow_long_disguise)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_disguised_long_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_dash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_short_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_slash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_dos_option(args);
        });
    }

    style_parsers.push_back(
                [this](std::vector<std::string>& args) {
        return parse_terminator(args);
    });

    std::vector<option> result;
    std::vector<std::string>& args = m_rawArguments;

    while(!args.empty())
    {
        bool ok = false;
        for(unsigned i = 0; i < style_parsers.size(); ++i)
        {
            unsigned current_size = static_cast<unsigned>(args.size());
            std::vector<option> next = style_parsers[i](args);

            // Check that option names
            // are valid, and that all values are in place.
            if (!next.empty())
            {
                std::vector<std::string> e;
                for(unsigned k = 0; k < next.size()-1; ++k) {
                    finish_option(next[k], e, style_parsers);
                }
                // For the last option, pass the unparsed tokens
                // so that they can be added to next.back()'s values
                // if appropriate.
                finish_option(next.back(), args, style_parsers);
                for (unsigned j = 0; j < next.size(); ++j)
                    result.push_back(next[j]);
            }

            if (args.size() != current_size) {
                ok = true;
                break;
            }
        }

        if (!ok) {
            option opt;
            opt.value.push_back(args[0]);
            opt.original_tokens.push_back(args[0]);
            result.push_back(opt);
            args.erase(args.begin());
        }
    }

    /* If an key option is followed by a positional option,
       can can consume more tokens (e.g. it's multitoken option),
       give those tokens to it.  */
    std::vector<option> result2;
    for (unsigned i = 0; i < result.size(); ++i)
    {
        result2.push_back(result[i]);
        option& opt = result2.back();

        if (opt.string_key.empty())
            continue;

        const option_description* xd = nullptr;
        try
        {
            xd = m_options_description->find_nothrow(opt.string_key,
                is_style_active(allow_guessing),
                is_style_active(long_case_insensitive),
                is_style_active(short_case_insensitive));
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(opt.string_key, opt.original_tokens[0], get_canonical_option_prefix());
            throw;
        }

        if (!xd)
            continue;

        unsigned min_tokens = xd->semantic()->min_tokens();
        unsigned max_tokens = xd->semantic()->max_tokens();
        if (min_tokens < max_tokens && opt.value.size() < max_tokens)
        {
            // This option may grab some more tokens.
            // We only allow to grab tokens that are not already
            // recognized as key options.

            int can_take_more = max_tokens - static_cast<int>(opt.value.size());
            unsigned j = i+1;
            for (; can_take_more && j < result.size(); --can_take_more, ++j)
            {
                option& opt2 = result[j];
                if (!opt2.string_key.empty())
                    break;

                if (opt2.position_key == INT_MAX)
                {
                    // We use INT_MAX to mark positional options that
                    // were found after the '--' terminator and therefore
                    // should stay positional forever.
                    break;
                }

                assert(opt2.value.size() == 1);

                opt.value.push_back(opt2.value[0]);

                assert(opt2.original_tokens.size() == 1);

                opt.original_tokens.push_back(opt2.original_tokens[0]);
            }
            i = j-1;
        }
    }
    result.swap(result2);


    // Assign position keys to positional options.
    int position_key = 0;
    for(unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.empty())
            result[i].position_key = position_key++;
    }

    if (m_positional_options_description)
    {
        unsigned position = 0;
        for (unsigned i = 0; i < result.size(); ++i) {
            option& opt = result[i];
            if (opt.position_key != -1) {
                if (position >= m_positional_options_description->max_total_count())
                {
                    throw too_many_positional_options_error();
                }
                opt.string_key = m_positional_options_description->name_for_position(position);
                ++position;
            }
        }
    }

    // set case sensitive flag
    for (unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.size() > 2 ||
                (result[i].string_key.size() > 1 && result[i].string_key[0] != '-'))
        {
            // it is a long option
            result[i].case_insensitive = is_style_active(long_case_insensitive);
        }
        else
        {
            // it is a short option
            result[i].case_insensitive = is_style_active(short_case_insensitive);
        }
    }

    return result;
}